

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MercuryData.h
# Opt level: O0

istream * operator>>(istream *in,MercuryParticle<3UL> *part)

{
  long in_RSI;
  istream *in_RDI;
  size_t i;
  undefined8 local_18;
  
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    std::istream::operator>>(in_RDI,(double *)(in_RSI + local_18 * 8));
  }
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    std::istream::operator>>(in_RDI,(double *)(in_RSI + 0x18 + local_18 * 8));
  }
  std::istream::operator>>(in_RDI,(double *)(in_RSI + 0x60));
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    std::istream::operator>>(in_RDI,(double *)(in_RSI + 0x30 + local_18 * 8));
  }
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    std::istream::operator>>(in_RDI,(double *)(in_RSI + 0x48 + local_18 * 8));
  }
  std::istream::operator>>(in_RDI,(ulong *)(in_RSI + 0x68));
  return in_RDI;
}

Assistant:

std::istream& operator>>(std::istream& in, MercuryParticle<NDIMS>& part)
{
  std::size_t i;
  for (i = 0; i < NDIMS; i++)
    in >> part.position[i];
  
  for (i = 0; i < NDIMS; i++)
    in >> part.velocity[i];
    
  in >> part.radius;
  
  for (i = 0; i < NDIMS; i++)
    in >> part.rotation[i];
    
  for (i = 0; i < NDIMS; i++)
    in >> part.angularV[i];
    
  in >> part.speciesID;
  
  return in;
}